

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O0

ssize_t __thiscall
QNetworkAccessFileBackend::read
          (QNetworkAccessFileBackend *this,int __fd,void *__buf,size_t __nbytes)

{
  Operation OVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  QString *args;
  long in_FS_OFFSET;
  qint64 actuallyRead;
  QString msg;
  NetworkError in_stack_ffffffffffffff4c;
  QNetworkAccessBackend *in_stack_ffffffffffffff50;
  QNetworkAccessFileBackend *this_00;
  long local_80;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_5c;
  QUrl local_58;
  undefined1 local_50 [24];
  char local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  args = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  OVar1 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)0x19929a);
  if (OVar1 == GetOperation) {
    local_80 = QIODevice::read((char *)(this + 0x10),(longlong)args);
    if (local_80 < 1) {
      iVar2 = QFileDevice::error();
      if (iVar2 == 0) {
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x19940d);
      }
      else {
        local_20 = 0xaaaaaaaaaaaaaaaa;
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        QCoreApplication::translate
                  (local_38,"QNetworkAccessFileBackend","Read error reading from %1: %2",0);
        QNetworkAccessBackend::url((QNetworkAccessBackend *)this);
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                  (&local_5c,PrettyDecoded);
        QUrl::toString((QUrlTwoFlags_conflict1 *)local_50);
        QIODevice::errorString();
        QString::arg<QString,QString>((QString *)this_00,args,(QString *)__buf);
        QString::~QString((QString *)0x1993a9);
        QString::~QString((QString *)0x1993b3);
        QUrl::~QUrl(&local_58);
        QString::~QString((QString *)0x1993ca);
        QNetworkAccessBackend::error
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(QString *)0x1993e1);
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x1993eb);
        local_80 = -1;
        QString::~QString((QString *)0x199401);
      }
    }
    else {
      uVar3 = QFileDevice::isSequential();
      if (((uVar3 & 1) == 0) && (uVar3 = QFileDevice::atEnd(), (uVar3 & 1) != 0)) {
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x199449);
      }
      *(long *)(this + 0x20) = local_80 + *(long *)(this + 0x20);
    }
  }
  else {
    local_80 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_80;
}

Assistant:

qint64 QNetworkAccessFileBackend::read(char *data, qint64 maxlen)
{
    if (operation() != QNetworkAccessManager::GetOperation)
        return 0;
    qint64 actuallyRead = file.read(data, maxlen);
    if (actuallyRead <= 0) {
        // EOF or error
        if (file.error() != QFile::NoError) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Read error reading from %1: %2")
                            .arg(url().toString(), file.errorString());
            error(QNetworkReply::ProtocolFailure, msg);

            finished();
            return -1;
        }

        finished();
        return actuallyRead;
    }
    if (!file.isSequential() && file.atEnd())
        finished();
    totalBytes += actuallyRead;
    return actuallyRead;
}